

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

uint32_t __thiscall mjs::bound_function_args::bound_args_len(bound_function_args *this)

{
  uint32_t uVar1;
  gc_vector<mjs::value_representation> *this_00;
  
  if ((this->bound_args_).pos_ != 0) {
    this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>,_true>::dereference
                        (&this->bound_args_,this->heap_);
    uVar1 = gc_vector<mjs::value_representation>::length(this_00);
    return uVar1;
  }
  return 0;
}

Assistant:

explicit operator bool() const { return pos_; }